

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserManager.hpp
# Opt level: O0

void __thiscall sjtu::UserManager::~UserManager(UserManager *this)

{
  _Ios_Openmode _Var1;
  long in_RDI;
  ofstream outfile;
  BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *this_00;
  char local_208 [520];
  
  if (*(long **)(in_RDI + 0x10) != (long *)0x0) {
    (**(code **)(**(long **)(in_RDI + 0x10) + 0x28))();
  }
  this_00 = *(BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> **)
             (in_RDI + 8);
  if (this_00 != (BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *)0x0) {
    BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::~BplusTree(this_00);
    operator_delete(this_00,0x18);
  }
  _Var1 = std::operator|(_S_out,_S_bin);
  std::ofstream::ofstream(local_208,"OnlineFlag.dat",_Var1);
  std::ostream::write(local_208,in_RDI + 0x18);
  std::ofstream::close();
  std::ofstream::~ofstream(local_208);
  return;
}

Assistant:

~UserManager() {
            delete UserFile;
            delete UserBpTree;
            	std::ofstream outfile("OnlineFlag.dat" , std::ios_base::out | std::ios_base::binary);
            	outfile.write(reinterpret_cast<char *>(&online_flag) , sizeof (unsigned int));
            	outfile.close();
        }